

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++:221:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_membrane_test_c__:221:17)>
            *this)

{
  long *plVar1;
  WirePointer *pWVar2;
  undefined8 uVar3;
  CapTableBuilder *pCVar4;
  RequestHook *pRVar5;
  undefined8 *puVar6;
  CapTableBuilder *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  int in_R8D;
  bool bVar7;
  Own<capnp::ClientHook,_std::nullptr_t> OVar8;
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  req;
  char *pcVar9;
  char *pcVar10;
  undefined8 uVar11;
  undefined1 local_148 [16];
  long *local_138;
  WirePointer *local_130;
  undefined8 uStack_128;
  Disposer *local_120;
  PointerBuilder local_118;
  undefined8 local_100;
  short local_f4;
  undefined4 local_f0;
  undefined8 *local_e8;
  long *local_e0;
  char *local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  local_b8;
  undefined1 local_78 [24];
  Maybe<capnp::MessageSize> local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined4 local_30;
  
  local_60.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::loopbackRequest
            (&local_b8,&((this->f).env)->membraned,&local_60);
  puVar6 = (undefined8 *)operator_new(0x28);
  __n = (CapTableBuilder *)(puVar6 + 3);
  puVar6[4] = 0;
  *puVar6 = 0x6b7750;
  puVar6[3] = 0x6b7790;
  puVar6[1] = "outside";
  puVar6[2] = 8;
  local_118.segment =
       (SegmentBuilder *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::ThingImpl>::instance;
  local_118.capTable = __n;
  OVar8 = capnp::Capability::Client::makeLocalClient
                    ((Client *)(local_148 + 8),
                     (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_118);
  pCVar4 = local_118.capTable;
  if (local_118.capTable != (CapTableBuilder *)0x0) {
    local_118.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_118.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_118.segment,
               (pCVar4->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar4->super_CapTableReader)._vptr_CapTableReader,OVar8.ptr);
  }
  local_148._0_8_ = &capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  local_118.segment = local_b8.super_Builder._builder.segment;
  local_118.capTable = local_b8.super_Builder._builder.capTable;
  local_118.pointer = local_b8.super_Builder._builder.pointers;
  capnp::_::PointerBuilder::setCapability
            (&local_118,(Own<capnp::ClientHook,_std::nullptr_t> *)(local_148 + 8));
  plVar1 = local_138;
  __buf = extraout_RDX;
  if (local_138 != (long *)0x0) {
    local_138 = (long *)0x0;
    (**((CapTableReader *)local_148._8_8_)->_vptr_CapTableReader)
              (local_148._8_8_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    __buf = extraout_RDX_00;
  }
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
  ::send((Request<capnproto_test::capnp::test::TestMembrane::LoopbackParams,_capnproto_test::capnp::test::TestMembrane::LoopbackResults>
          *)local_148,(int)&local_b8,__buf,(size_t)__n,in_R8D);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
  ;
  pcStack_c8 = "operator()";
  local_c0 = 0xc000000e0;
  uVar11 = 0xc000000e0;
  pcVar9 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
  ;
  pcVar10 = "operator()";
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::LoopbackResults>_>
              *)&local_118,local_148);
  bVar7 = local_f4 != 0;
  local_38 = 0;
  if (bVar7) {
    local_38 = local_100;
  }
  local_30 = 0x7fffffff;
  if (bVar7) {
    local_30 = local_f0;
  }
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  if (bVar7) {
    local_48 = local_118.segment._0_4_;
    uStack_44 = local_118.segment._4_4_;
    uStack_40 = local_118.capTable._0_4_;
    uStack_3c = local_118.capTable._4_4_;
  }
  OVar8 = capnp::_::PointerReader::getCapability((PointerReader *)local_78);
  plVar1 = local_e0;
  *(undefined4 *)&__return_storage_ptr__->field_0x8 = local_78._0_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_78._4_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x10 = local_78._8_4_;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = local_78._12_4_;
  __return_storage_ptr__->_vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Thing::Client::typeinfo;
  if (local_e0 != (long *)0x0) {
    local_e0 = (long *)0x0;
    (**(code **)*local_e8)(local_e8,(long)plVar1 + *(long *)(*plVar1 + -0x10),OVar8.ptr);
  }
  uVar3 = uStack_128;
  pWVar2 = local_130;
  if (local_130 != (WirePointer *)0x0) {
    local_130 = (WirePointer *)0x0;
    uStack_128._0_4_ = 0;
    uStack_128._4_2_ = 0;
    uStack_128._6_2_ = 0;
    (**local_120->_vptr_Disposer)(local_120,pWVar2,8,uVar3,uVar3,0,pcVar9,pcVar10,uVar11);
  }
  plVar1 = local_138;
  if (local_138 != (long *)0x0) {
    local_138 = (long *)0x0;
    (**((CapTableReader *)local_148._8_8_)->_vptr_CapTableReader)
              (local_148._8_8_,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  uVar11 = local_148._0_8_;
  if ((SegmentBuilder *)local_148._0_8_ != (SegmentBuilder *)0x0) {
    local_148._0_8_ = (SegmentBuilder *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar11);
  }
  pRVar5 = local_b8.hook.ptr;
  if (local_b8.hook.ptr != (RequestHook *)0x0) {
    local_b8.hook.ptr = (RequestHook *)0x0;
    (**(local_b8.hook.disposer)->_vptr_Disposer)
              (local_b8.hook.disposer,
               (_func_int *)((long)&pRVar5->_vptr_RequestHook + (long)pRVar5->_vptr_RequestHook[-2])
              );
  }
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }